

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool cinatra::is_valid_utf8(uchar *s,size_t length)

{
  uchar *puVar1;
  uchar *e;
  size_t length_local;
  uchar *s_local;
  
  puVar1 = s + length;
  s_local = s;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if (s_local == puVar1) {
            return true;
          }
          if ((puVar1 < s_local + 4) || ((*(uint *)s_local & 0x80808080) != 0)) break;
          s_local = s_local + 4;
        }
        while ((*s_local & 0x80) == 0) {
          s_local = s_local + 1;
          if (s_local == puVar1) {
            return true;
          }
        }
        if ((*s_local & 0x60) != 0x40) break;
        if (((puVar1 <= s_local + 1) || ((s_local[1] & 0xc0) != 0x80)) ||
           ((*s_local & 0xfe) == 0xc0)) {
          return false;
        }
        s_local = s_local + 2;
      }
      if ((*s_local & 0xf0) != 0xe0) break;
      if ((((puVar1 <= s_local + 2) || ((s_local[1] & 0xc0) != 0x80)) ||
          (((s_local[2] & 0xc0) != 0x80 || ((*s_local == 0xe0 && ((s_local[1] & 0xe0) == 0x80))))))
         || ((*s_local == 0xed && ((s_local[1] & 0xe0) == 0xa0)))) {
        return false;
      }
      s_local = s_local + 3;
    }
    if ((*s_local & 0xf8) != 0xf0) {
      return false;
    }
    if ((((((puVar1 <= s_local + 3) || ((s_local[1] & 0xc0) != 0x80)) ||
          ((s_local[2] & 0xc0) != 0x80)) ||
         (((s_local[3] & 0xc0) != 0x80 || ((*s_local == 0xf0 && ((s_local[1] & 0xf0) == 0x80))))))
        || ((*s_local == 0xf4 && (0x8f < s_local[1])))) || (0xf4 < *s_local)) break;
    s_local = s_local + 4;
  }
  return false;
}

Assistant:

inline bool is_valid_utf8(unsigned char *s, size_t length) {
  for (unsigned char *e = s + length; s != e;) {
    if (s + 4 <= e && ((*(uint32_t *)s) & 0x80808080) == 0) {
      s += 4;
    }
    else {
      while (!(*s & 0x80)) {
        if (++s == e) {
          return true;
        }
      }

      if ((s[0] & 0x60) == 0x40) {
        if (s + 1 >= e || (s[1] & 0xc0) != 0x80 || (s[0] & 0xfe) == 0xc0) {
          return false;
        }
        s += 2;
      }
      else if ((s[0] & 0xf0) == 0xe0) {
        if (s + 2 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
            (s[0] == 0xe0 && (s[1] & 0xe0) == 0x80) ||
            (s[0] == 0xed && (s[1] & 0xe0) == 0xa0)) {
          return false;
        }
        s += 3;
      }
      else if ((s[0] & 0xf8) == 0xf0) {
        if (s + 3 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
            (s[3] & 0xc0) != 0x80 || (s[0] == 0xf0 && (s[1] & 0xf0) == 0x80) ||
            (s[0] == 0xf4 && s[1] > 0x8f) || s[0] > 0xf4) {
          return false;
        }
        s += 4;
      }
      else {
        return false;
      }
    }
  }
  return true;
}